

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  int a;
  int b;
  ostream *poVar2;
  double dVar3;
  string local_40;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter two numbers a and b:\n");
  std::operator<<(poVar2,"a: ");
  readNumber_abi_cxx11_();
  a = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<((ostream *)&std::cout,"b: ");
  readNumber_abi_cxx11_();
  b = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_40);
  cVar1 = promptCalculationType();
  if (cVar1 == 'P') {
    dVar3 = permutations(a,b);
  }
  else {
    dVar3 = combinations(a,b);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,a);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,b);
  poVar2 = std::operator<<(poVar2,") = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)dVar3);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main()
{
	int32_t a = 0;
	int32_t b = 0;
	std::cout << "Enter two numbers a and b:\n"
			  << "a: ";
	a = std::stoi(readNumber());
	std::cout << "b: ";
	b = std::stoi(readNumber());

	auto answer = promptCalculationType();
	int32_t result = 0;
	if (answer == 'P')
		result = permutations(a, b);
	else
		result = combinations(a, b);
	std::cout << answer << "(" << a << ", " << b << ") = " << result << '\n';
	return 0;
}